

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj-design.c
# Opt level: O1

void haggle_till_done(artifact *art,object *obj)

{
  wchar_t index;
  char *prop_name;
  int16_t *piVar1;
  _Bool _Var2;
  _Bool _Var3;
  _Bool _Var4;
  uint32_t uVar5;
  uint32_t uVar6;
  wchar_t wVar7;
  int iVar8;
  wchar_t wVar9;
  object_kind *kind;
  obj_property *poVar10;
  short sVar11;
  char *pcVar12;
  element_info *peVar13;
  int16_t *piVar14;
  int iVar15;
  int16_t *piVar16;
  int16_t *piVar17;
  
  if (art == (artifact *)0x0) {
    wVar7 = (wchar_t)obj->tval;
    wVar9 = (wchar_t)obj->sval;
  }
  else {
    wVar7 = art->tval;
    wVar9 = art->sval;
  }
  kind = lookup_kind(wVar7,wVar9);
  _Var2 = tval_is_melee_weapon_k(kind);
  _Var3 = tval_is_launcher_k(kind);
  uVar5 = Rand_div(6);
  if ((uVar5 == 0) && (L'ᆓ' < potential)) {
    get_property(art,obj,"strength",L'\x01',true);
    get_property(art,obj,"wisdom",L'\x01',true);
    get_property(art,obj,"intelligence",L'\x01',true);
    get_property(art,obj,"dexterity",L'\x01',true);
    get_property(art,obj,"constitution",L'\x01',true);
  }
  else {
    uVar5 = Rand_div(3);
    if ((uVar5 != 0) && (L'˭' < potential)) {
      uVar5 = Rand_div(2);
      wVar7 = potential;
      uVar6 = Rand_div(2);
      if (-1 < (int)uVar5) {
        iVar15 = uVar5 + 1;
        do {
          uVar5 = Rand_div(_Var2 + 9);
          if (uVar5 < 10) {
            get_property(art,obj,&DAT_0022f09c + *(int *)(&DAT_0022f09c + (ulong)uVar5 * 4),
                         uVar6 + wVar7 / 2000 + L'\x01',true);
          }
          iVar15 = iVar15 + -1;
        } while (iVar15 != 0);
      }
    }
  }
  uVar5 = Rand_div(8);
  if (uVar5 == 0) {
    uVar5 = Rand_div(0xd);
    switch(uVar5) {
    case 0:
      _Var4 = has_property(art,obj,"acid resistance");
      if (!_Var4) {
        uVar6 = Rand_div(6);
        get_property(art,obj,"acid resistance",uVar6 * -5 + L'\xfffffffb',true);
      }
      switch(uVar5) {
      case 1:
        goto switchD_0018f4ad_caseD_1;
      case 2:
        goto switchD_0018f4ad_caseD_2;
      case 3:
        goto switchD_0018f4ad_caseD_3;
      case 4:
        goto switchD_0018f4ad_caseD_4;
      case 5:
        goto switchD_0018f4ad_caseD_5;
      case 6:
        goto switchD_0018f4ad_caseD_6;
      case 7:
        goto switchD_0018f4ad_caseD_7;
      case 8:
        goto switchD_0018f4ad_caseD_8;
      case 9:
        goto switchD_0018f4ad_caseD_9;
      case 10:
        goto switchD_0018f4ad_caseD_a;
      case 0xb:
        goto switchD_0018f4ad_caseD_b;
      case 0xc:
        goto switchD_0018f4ad_caseD_c;
      }
      break;
    case 1:
switchD_0018f4ad_caseD_1:
      _Var4 = has_property(art,obj,"electricity resistance");
      if (!_Var4) {
        uVar6 = Rand_div(6);
        get_property(art,obj,"electricity resistance",uVar6 * -5 + L'\xfffffffb',true);
      }
      switch(uVar5) {
      case 2:
        goto switchD_0018f4ad_caseD_2;
      case 3:
        goto switchD_0018f4ad_caseD_3;
      case 4:
        goto switchD_0018f4ad_caseD_4;
      case 5:
        goto switchD_0018f4ad_caseD_5;
      case 6:
        goto switchD_0018f4ad_caseD_6;
      case 7:
        goto switchD_0018f4ad_caseD_7;
      case 8:
        goto switchD_0018f4ad_caseD_8;
      case 9:
        goto switchD_0018f4ad_caseD_9;
      case 10:
        goto switchD_0018f4ad_caseD_a;
      case 0xb:
        goto switchD_0018f4ad_caseD_b;
      case 0xc:
        goto switchD_0018f4ad_caseD_c;
      }
      break;
    case 2:
switchD_0018f4ad_caseD_2:
      _Var4 = has_property(art,obj,"fire resistance");
      if (!_Var4) {
        uVar6 = Rand_div(6);
        get_property(art,obj,"fire resistance",uVar6 * -5 + L'\xfffffffb',true);
      }
      switch(uVar5) {
      case 3:
        goto switchD_0018f4ad_caseD_3;
      case 4:
        goto switchD_0018f4ad_caseD_4;
      case 5:
        goto switchD_0018f4ad_caseD_5;
      case 6:
        goto switchD_0018f4ad_caseD_6;
      case 7:
        goto switchD_0018f4ad_caseD_7;
      case 8:
        goto switchD_0018f4ad_caseD_8;
      case 9:
        goto switchD_0018f4ad_caseD_9;
      case 10:
        goto switchD_0018f4ad_caseD_a;
      case 0xb:
        goto switchD_0018f4ad_caseD_b;
      case 0xc:
        goto switchD_0018f4ad_caseD_c;
      }
      break;
    case 3:
switchD_0018f4ad_caseD_3:
      _Var4 = has_property(art,obj,"cold resistance");
      if (!_Var4) {
        uVar6 = Rand_div(6);
        get_property(art,obj,"cold resistance",uVar6 * -5 + L'\xfffffffb',true);
      }
      switch(uVar5) {
      case 4:
        goto switchD_0018f4ad_caseD_4;
      case 5:
        goto switchD_0018f4ad_caseD_5;
      case 6:
        goto switchD_0018f4ad_caseD_6;
      case 7:
        goto switchD_0018f4ad_caseD_7;
      case 8:
        goto switchD_0018f4ad_caseD_8;
      case 9:
        goto switchD_0018f4ad_caseD_9;
      case 10:
        goto switchD_0018f4ad_caseD_a;
      case 0xb:
        goto switchD_0018f4ad_caseD_b;
      case 0xc:
        goto switchD_0018f4ad_caseD_c;
      }
      break;
    case 4:
switchD_0018f4ad_caseD_4:
      _Var4 = has_property(art,obj,"poison resistance");
      if (!_Var4) {
        uVar6 = Rand_div(6);
        get_property(art,obj,"poison resistance",uVar6 * -5 + L'\xfffffffb',true);
      }
      switch(uVar5) {
      case 5:
        goto switchD_0018f4ad_caseD_5;
      case 6:
        goto switchD_0018f4ad_caseD_6;
      case 7:
        goto switchD_0018f4ad_caseD_7;
      case 8:
        goto switchD_0018f4ad_caseD_8;
      case 9:
        goto switchD_0018f4ad_caseD_9;
      case 10:
        goto switchD_0018f4ad_caseD_a;
      case 0xb:
        goto switchD_0018f4ad_caseD_b;
      case 0xc:
        goto switchD_0018f4ad_caseD_c;
      }
      break;
    case 5:
switchD_0018f4ad_caseD_5:
      _Var4 = has_property(art,obj,"light resistance");
      if (!_Var4) {
        uVar6 = Rand_div(6);
        get_property(art,obj,"light resistance",uVar6 * -5 + L'\xfffffffb',true);
      }
      switch(uVar5) {
      case 6:
        goto switchD_0018f4ad_caseD_6;
      case 7:
        goto switchD_0018f4ad_caseD_7;
      case 8:
        goto switchD_0018f4ad_caseD_8;
      case 9:
        goto switchD_0018f4ad_caseD_9;
      case 10:
        goto switchD_0018f4ad_caseD_a;
      case 0xb:
        goto switchD_0018f4ad_caseD_b;
      case 0xc:
        goto switchD_0018f4ad_caseD_c;
      }
      break;
    case 6:
switchD_0018f4ad_caseD_6:
      _Var4 = has_property(art,obj,"dark resistance");
      if (!_Var4) {
        uVar6 = Rand_div(6);
        get_property(art,obj,"dark resistance",uVar6 * -5 + L'\xfffffffb',true);
      }
      switch(uVar5) {
      case 7:
        goto switchD_0018f4ad_caseD_7;
      case 8:
        goto switchD_0018f4ad_caseD_8;
      case 9:
        goto switchD_0018f4ad_caseD_9;
      case 10:
        goto switchD_0018f4ad_caseD_a;
      case 0xb:
        goto switchD_0018f4ad_caseD_b;
      case 0xc:
        goto switchD_0018f4ad_caseD_c;
      }
      break;
    case 7:
switchD_0018f4ad_caseD_7:
      _Var4 = has_property(art,obj,"sound resistance");
      if (!_Var4) {
        uVar6 = Rand_div(6);
        get_property(art,obj,"sound resistance",uVar6 * -5 + L'\xfffffffb',true);
      }
      switch(uVar5) {
      case 8:
        goto switchD_0018f4ad_caseD_8;
      case 9:
        goto switchD_0018f4ad_caseD_9;
      case 10:
        goto switchD_0018f4ad_caseD_a;
      case 0xb:
        goto switchD_0018f4ad_caseD_b;
      case 0xc:
        goto switchD_0018f4ad_caseD_c;
      }
      break;
    case 8:
switchD_0018f4ad_caseD_8:
      _Var4 = has_property(art,obj,"shards resistance");
      if (!_Var4) {
        uVar6 = Rand_div(6);
        get_property(art,obj,"shards resistance",uVar6 * -5 + L'\xfffffffb',true);
      }
      switch(uVar5) {
      case 9:
        goto switchD_0018f4ad_caseD_9;
      case 10:
        goto switchD_0018f4ad_caseD_a;
      case 0xb:
        goto switchD_0018f4ad_caseD_b;
      case 0xc:
        goto switchD_0018f4ad_caseD_c;
      }
      break;
    case 9:
switchD_0018f4ad_caseD_9:
      _Var4 = has_property(art,obj,"nexus resistance");
      if (!_Var4) {
        uVar6 = Rand_div(6);
        get_property(art,obj,"nexus resistance",uVar6 * -5 + L'\xfffffffb',true);
      }
      if (uVar5 == 0xc) goto switchD_0018f4ad_caseD_c;
      if (uVar5 == 0xb) goto switchD_0018f4ad_caseD_b;
      if (uVar5 == 10) goto switchD_0018f4ad_caseD_a;
      break;
    case 10:
switchD_0018f4ad_caseD_a:
      _Var4 = has_property(art,obj,"nether resistance");
      if (!_Var4) {
        uVar6 = Rand_div(6);
        get_property(art,obj,"nether resistance",uVar6 * -5 + L'\xfffffffb',true);
      }
      if (uVar5 == 0xc) goto switchD_0018f4ad_caseD_c;
      if (uVar5 == 0xb) goto switchD_0018f4ad_caseD_b;
      break;
    case 0xb:
switchD_0018f4ad_caseD_b:
      _Var4 = has_property(art,obj,"chaos resistance");
      if (!_Var4) {
        uVar6 = Rand_div(6);
        get_property(art,obj,"chaos resistance",uVar6 * -5 + L'\xfffffffb',true);
      }
      if (uVar5 == 0xc) goto switchD_0018f4ad_caseD_c;
      break;
    case 0xc:
switchD_0018f4ad_caseD_c:
      _Var4 = has_property(art,obj,"disenchantment resistance");
      if (!_Var4) {
        uVar5 = Rand_div(6);
        get_property(art,obj,"disenchantment resistance",uVar5 * -5 + L'\xfffffffb',true);
      }
    }
  }
  if ((L'ߐ' < potential) && (uVar5 = Rand_div(3), uVar5 != 0)) {
    uVar5 = Rand_div(5);
    switch(uVar5) {
    case 0:
      _Var4 = has_property(art,obj,"telepathy");
      if (!_Var4) {
        get_property(art,obj,"telepathy",L'\0',true);
      }
      if (uVar5 == 3) goto switchD_0018d78b_caseD_3;
      if (uVar5 == 2) goto switchD_0018d78b_caseD_2;
      if (uVar5 == 1) goto switchD_0018d78b_caseD_1;
      break;
    case 1:
switchD_0018d78b_caseD_1:
      _Var4 = has_property(art,obj,"hold life");
      if (!_Var4) {
        get_property(art,obj,"hold life",L'\0',true);
      }
      if (uVar5 == 3) goto switchD_0018d78b_caseD_3;
      if (uVar5 == 2) goto switchD_0018d78b_caseD_2;
      break;
    case 2:
switchD_0018d78b_caseD_2:
      _Var4 = has_property(art,obj,"protection from confusion");
      if (!_Var4) {
        get_property(art,obj,"protection from confusion",L'\0',true);
      }
      _Var4 = has_property(art,obj,"protection from blindness");
      if (!_Var4) {
        get_property(art,obj,"protection from blindness",L'\0',true);
      }
      if (uVar5 == 3) goto switchD_0018d78b_caseD_3;
      break;
    case 3:
switchD_0018d78b_caseD_3:
      uVar6 = Rand_div(4);
      if (uVar6 == 0) {
        pcVar12 = "disenchantment resistance";
        _Var4 = has_property(art,obj,"disenchantment resistance");
        if (_Var4) goto LAB_0018d8a7;
      }
      else {
LAB_0018d8a7:
        uVar6 = Rand_div(3);
        if (uVar6 == 0) {
          pcVar12 = "nether resistance";
          _Var4 = has_property(art,obj,"nether resistance");
          if (!_Var4) goto LAB_0018d90e;
        }
        uVar6 = Rand_div(2);
        if (uVar6 == 0) {
          pcVar12 = "chaos resistance";
          _Var4 = has_property(art,obj,"chaos resistance");
          if (!_Var4) goto LAB_0018d90e;
        }
        pcVar12 = "poison resistance";
        _Var4 = has_property(art,obj,"poison resistance");
        if (_Var4) break;
      }
LAB_0018d90e:
      get_property(art,obj,pcVar12,L'\0',true);
    }
    if ((uVar5 == 4) && (L'ᆔ' < potential)) {
      uVar5 = Rand_div(2);
      if ((uVar5 != 0) || (_Var4 = has_property(art,obj,"speed"), _Var4)) {
        get_property(art,obj,"sustain strength",L'\0',true);
        get_property(art,obj,"sustain wisdom",L'\0',true);
        get_property(art,obj,"sustain intelligence",L'\0',true);
        get_property(art,obj,"sustain dexterity",L'\0',true);
        pcVar12 = "sustain constitution";
        wVar7 = L'\0';
      }
      else {
        uVar5 = Rand_div(10);
        wVar7 = uVar5 + L'\x01';
        pcVar12 = "speed";
      }
      get_property(art,obj,pcVar12,wVar7,true);
    }
  }
  uVar5 = Rand_div(5);
  if (((int)uVar5 < 2) || (L'ઽ' < potential)) {
    uVar5 = Rand_div(3);
    uVar6 = Rand_div(_Var2 | 8);
    if (uVar6 < 9) {
      get_property(art,obj,&DAT_0022f0c4 + *(int *)(&DAT_0022f0c4 + (ulong)uVar6 * 4),
                   uVar5 + L'\x01',true);
    }
  }
  if (L'ī' < potential) {
    iVar15 = -0x15;
    do {
      iVar15 = iVar15 + 1;
      if (iVar15 == 0) break;
      if (_Var2) {
        if (art == (artifact *)0x0) {
          __assert_fail("art",
                        "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/obj-design.c"
                        ,0xb53,"void haggle_till_done(struct artifact *, struct object *)");
        }
        _Var4 = flag_has_dbg(art->flags,6,0x29,"art->flags","OF_THROWING");
        if ((_Var4) && (uVar5 = Rand_div(2), uVar5 == 0)) {
          get_property(art,obj,"perfect balance",L'\0',true);
        }
        _Var4 = has_property(art,obj,"enhanced dice");
        if (_Var4) {
          uVar5 = Rand_div(3);
          if ((uVar5 == 0) && (L'כ' < potential)) {
            if (art->weight == kind->weight) {
              uVar5 = Rand_div(3);
              if (uVar5 == 0) {
                uVar5 = Rand_div(art->weight / 10);
                wVar7 = uVar5 * 5 + art->weight + L'\n';
                art->weight = wVar7;
                iVar8 = (wVar7 - kind->weight) * 10;
              }
              else {
                uVar5 = Rand_div(2);
                if ((uVar5 != 0) || (art->weight < L'\x96')) goto LAB_0018dc0c;
                uVar5 = Rand_div((uint)art->weight / 10);
                wVar7 = uVar5 * -5 + art->weight + L'\xfffffff6';
                art->weight = wVar7;
                iVar8 = (kind->weight - wVar7) * -10;
              }
              potential = potential + iVar8;
            }
LAB_0018dc0c:
            uVar5 = Rand_div(3);
            if ((uVar5 == 0) && (initial_potential < L'ྡ')) {
              uVar5 = Rand_div(3);
              if (uVar5 != 0) {
                art->to_h = 0;
                potential = potential + L'ɘ';
                uVar5 = Rand_div(4);
                if (uVar5 == 0) {
                  art->to_h = 0;
                  potential = potential + L'ɘ';
                }
              }
              get_property(art,obj,"enhanced dice",L'\x01',true);
              break;
            }
          }
        }
        else {
          uVar5 = Rand_div((uint)art->ds * (uint)art->dd);
          if (((int)uVar5 < 4) || (L'࠳' < potential)) {
            get_property(art,obj,"enhanced dice",L'\x03',true);
          }
        }
        uVar5 = Rand_div(0xd);
        switch(uVar5) {
        case 0:
          _Var4 = has_property(art,obj,"slay animals");
          if (!_Var4) {
            get_property(art,obj,"slay animals",L'\x11',true);
          }
          switch(uVar5) {
          case 1:
            goto switchD_0018dc50_caseD_1;
          case 2:
            goto switchD_0018dc50_caseD_2;
          case 3:
            goto switchD_0018dc50_caseD_3;
          case 4:
            goto switchD_0018dc50_caseD_4;
          case 5:
            goto switchD_0018dc50_caseD_5;
          case 6:
            goto switchD_0018dc50_caseD_6;
          case 7:
            goto switchD_0018dc50_caseD_7;
          case 8:
            goto switchD_0018dc50_caseD_8;
          case 9:
            goto switchD_0018dc50_caseD_9;
          case 10:
            goto switchD_0018dc50_caseD_a;
          case 0xb:
            goto switchD_0018dc50_caseD_b;
          case 0xc:
            goto switchD_0018dc50_caseD_c;
          }
          break;
        case 1:
switchD_0018dc50_caseD_1:
          _Var4 = has_property(art,obj,"slay evil creatures");
          if (!_Var4) {
            get_property(art,obj,"slay evil creatures",L'\x0f',true);
          }
          switch(uVar5) {
          case 2:
            goto switchD_0018dc50_caseD_2;
          case 3:
            goto switchD_0018dc50_caseD_3;
          case 4:
            goto switchD_0018dc50_caseD_4;
          case 5:
            goto switchD_0018dc50_caseD_5;
          case 6:
            goto switchD_0018dc50_caseD_6;
          case 7:
            goto switchD_0018dc50_caseD_7;
          case 8:
            goto switchD_0018dc50_caseD_8;
          case 9:
            goto switchD_0018dc50_caseD_9;
          case 10:
            goto switchD_0018dc50_caseD_a;
          case 0xb:
            goto switchD_0018dc50_caseD_b;
          case 0xc:
            goto switchD_0018dc50_caseD_c;
          }
          break;
        case 2:
switchD_0018dc50_caseD_2:
          _Var4 = has_property(art,obj,"slay undead");
          if (!_Var4) {
            get_property(art,obj,"slay undead",L'\x14',true);
          }
          switch(uVar5) {
          case 3:
            goto switchD_0018dc50_caseD_3;
          case 4:
            goto switchD_0018dc50_caseD_4;
          case 5:
            goto switchD_0018dc50_caseD_5;
          case 6:
            goto switchD_0018dc50_caseD_6;
          case 7:
            goto switchD_0018dc50_caseD_7;
          case 8:
            goto switchD_0018dc50_caseD_8;
          case 9:
            goto switchD_0018dc50_caseD_9;
          case 10:
            goto switchD_0018dc50_caseD_a;
          case 0xb:
            goto switchD_0018dc50_caseD_b;
          case 0xc:
            goto switchD_0018dc50_caseD_c;
          }
          break;
        case 3:
switchD_0018dc50_caseD_3:
          _Var4 = has_property(art,obj,"slay demons");
          if (!_Var4) {
            get_property(art,obj,"slay demons",L'\x14',true);
          }
          switch(uVar5) {
          case 4:
            goto switchD_0018dc50_caseD_4;
          case 5:
            goto switchD_0018dc50_caseD_5;
          case 6:
            goto switchD_0018dc50_caseD_6;
          case 7:
            goto switchD_0018dc50_caseD_7;
          case 8:
            goto switchD_0018dc50_caseD_8;
          case 9:
            goto switchD_0018dc50_caseD_9;
          case 10:
            goto switchD_0018dc50_caseD_a;
          case 0xb:
            goto switchD_0018dc50_caseD_b;
          case 0xc:
            goto switchD_0018dc50_caseD_c;
          }
          break;
        case 4:
switchD_0018dc50_caseD_4:
          _Var4 = has_property(art,obj,"slay orcs");
          if (!_Var4) {
            get_property(art,obj,"slay orcs",L'\x14',true);
          }
          switch(uVar5) {
          case 5:
            goto switchD_0018dc50_caseD_5;
          case 6:
            goto switchD_0018dc50_caseD_6;
          case 7:
            goto switchD_0018dc50_caseD_7;
          case 8:
            goto switchD_0018dc50_caseD_8;
          case 9:
            goto switchD_0018dc50_caseD_9;
          case 10:
            goto switchD_0018dc50_caseD_a;
          case 0xb:
            goto switchD_0018dc50_caseD_b;
          case 0xc:
            goto switchD_0018dc50_caseD_c;
          }
          break;
        case 5:
switchD_0018dc50_caseD_5:
          _Var4 = has_property(art,obj,"slay trolls");
          if (!_Var4) {
            get_property(art,obj,"slay trolls",L'\x14',true);
          }
          switch(uVar5) {
          case 6:
            goto switchD_0018dc50_caseD_6;
          case 7:
            goto switchD_0018dc50_caseD_7;
          case 8:
            goto switchD_0018dc50_caseD_8;
          case 9:
            goto switchD_0018dc50_caseD_9;
          case 10:
            goto switchD_0018dc50_caseD_a;
          case 0xb:
            goto switchD_0018dc50_caseD_b;
          case 0xc:
            goto switchD_0018dc50_caseD_c;
          }
          break;
        case 6:
switchD_0018dc50_caseD_6:
          _Var4 = has_property(art,obj,"slay giants");
          if (!_Var4) {
            get_property(art,obj,"slay giants",L'\x14',true);
          }
          switch(uVar5) {
          case 7:
            goto switchD_0018dc50_caseD_7;
          case 8:
            goto switchD_0018dc50_caseD_8;
          case 9:
            goto switchD_0018dc50_caseD_9;
          case 10:
            goto switchD_0018dc50_caseD_a;
          case 0xb:
            goto switchD_0018dc50_caseD_b;
          case 0xc:
            goto switchD_0018dc50_caseD_c;
          }
          break;
        case 7:
switchD_0018dc50_caseD_7:
          _Var4 = has_property(art,obj,"slay dragons");
          if (!_Var4) {
            get_property(art,obj,"slay dragons",L'\x14',true);
          }
          switch(uVar5) {
          case 8:
            goto switchD_0018dc50_caseD_8;
          case 9:
            goto switchD_0018dc50_caseD_9;
          case 10:
            goto switchD_0018dc50_caseD_a;
          case 0xb:
            goto switchD_0018dc50_caseD_b;
          case 0xc:
            goto switchD_0018dc50_caseD_c;
          }
          break;
        case 8:
switchD_0018dc50_caseD_8:
          _Var4 = has_property(art,obj,"acid brand");
          if (!_Var4) {
            get_property(art,obj,"acid brand",L'\x11',true);
          }
          switch(uVar5) {
          case 9:
            goto switchD_0018dc50_caseD_9;
          case 10:
            goto switchD_0018dc50_caseD_a;
          case 0xb:
            goto switchD_0018dc50_caseD_b;
          case 0xc:
            goto switchD_0018dc50_caseD_c;
          }
          break;
        case 9:
switchD_0018dc50_caseD_9:
          _Var4 = has_property(art,obj,"lightning brand");
          if (!_Var4) {
            get_property(art,obj,"lightning brand",L'\x11',true);
          }
          if (uVar5 == 0xc) goto switchD_0018dc50_caseD_c;
          if (uVar5 == 0xb) goto switchD_0018dc50_caseD_b;
          if (uVar5 == 10) goto switchD_0018dc50_caseD_a;
          break;
        case 10:
switchD_0018dc50_caseD_a:
          _Var4 = has_property(art,obj,"fire brand");
          if (!_Var4) {
            get_property(art,obj,"fire brand",L'\x11',true);
          }
          if (uVar5 == 0xc) goto switchD_0018dc50_caseD_c;
          if (uVar5 == 0xb) goto switchD_0018dc50_caseD_b;
          break;
        case 0xb:
switchD_0018dc50_caseD_b:
          _Var4 = has_property(art,obj,"cold brand");
          if (!_Var4) {
            get_property(art,obj,"cold brand",L'\x11',true);
          }
          if (uVar5 == 0xc) goto switchD_0018dc50_caseD_c;
          break;
        case 0xc:
switchD_0018dc50_caseD_c:
          _Var4 = has_property(art,obj,"poison brand");
          if (!_Var4) {
            get_property(art,obj,"poison brand",L'\x11',true);
          }
        }
        uVar5 = Rand_div(2);
        if (uVar5 == 0) {
          uVar5 = Rand_div(8);
          switch(uVar5) {
          case 0:
            _Var4 = has_property(art,obj,"slow digestion");
            if (!_Var4) {
              get_property(art,obj,"slow digestion",L'\0',false);
            }
            switch(uVar5) {
            case 1:
              goto switchD_0018ee8f_caseD_1;
            case 2:
              goto switchD_0018ee8f_caseD_2;
            case 3:
              goto switchD_0018ee8f_caseD_3;
            case 4:
              goto switchD_0018ee8f_caseD_4;
            case 5:
              goto switchD_0018ee8f_caseD_5;
            case 6:
              goto switchD_0018ee8f_caseD_6;
            case 7:
              goto switchD_0018ee8f_caseD_7;
            }
            break;
          case 1:
switchD_0018ee8f_caseD_1:
            _Var4 = has_property(art,obj,"feather falling");
            if (!_Var4) {
              get_property(art,obj,"feather falling",L'\0',false);
            }
            switch(uVar5) {
            case 2:
              goto switchD_0018ee8f_caseD_2;
            case 3:
              goto switchD_0018ee8f_caseD_3;
            case 4:
              goto switchD_0018ee8f_caseD_4;
            case 5:
              goto switchD_0018ee8f_caseD_5;
            case 6:
              goto switchD_0018ee8f_caseD_6;
            case 7:
              goto switchD_0018ee8f_caseD_7;
            }
            break;
          case 2:
switchD_0018ee8f_caseD_2:
            _Var4 = has_property(art,obj,"light");
            if (!_Var4) {
              get_property(art,obj,"light",L'\x01',false);
            }
            switch(uVar5) {
            case 3:
              goto switchD_0018ee8f_caseD_3;
            case 4:
              goto switchD_0018ee8f_caseD_4;
            case 5:
              goto switchD_0018ee8f_caseD_5;
            case 6:
              goto switchD_0018ee8f_caseD_6;
            case 7:
              goto switchD_0018ee8f_caseD_7;
            }
            break;
          case 3:
switchD_0018ee8f_caseD_3:
            _Var4 = has_property(art,obj,"regeneration");
            if (!_Var4) {
              get_property(art,obj,"regeneration",L'\0',false);
            }
            switch(uVar5) {
            case 4:
              goto switchD_0018ee8f_caseD_4;
            case 5:
              goto switchD_0018ee8f_caseD_5;
            case 6:
              goto switchD_0018ee8f_caseD_6;
            case 7:
              goto switchD_0018ee8f_caseD_7;
            }
            break;
          case 4:
switchD_0018ee8f_caseD_4:
            _Var4 = has_property(art,obj,"see invisible");
            if (!_Var4) {
              get_property(art,obj,"see invisible",L'\0',false);
            }
            if (uVar5 == 7) goto switchD_0018ee8f_caseD_7;
            if (uVar5 == 6) goto switchD_0018ee8f_caseD_6;
            if (uVar5 == 5) goto switchD_0018ee8f_caseD_5;
            break;
          case 5:
switchD_0018ee8f_caseD_5:
            _Var4 = has_property(art,obj,"free action");
            if (!_Var4) {
              get_property(art,obj,"free action",L'\0',false);
            }
            if (uVar5 == 7) goto switchD_0018ee8f_caseD_7;
            if (uVar5 == 6) goto switchD_0018ee8f_caseD_6;
            break;
          case 6:
switchD_0018ee8f_caseD_6:
            _Var4 = has_property(art,obj,"protection from fear");
            if (!_Var4) {
              get_property(art,obj,"protection from fear",L'\0',false);
            }
            if (uVar5 == 7) goto switchD_0018ee8f_caseD_7;
            break;
          case 7:
switchD_0018ee8f_caseD_7:
            _Var4 = has_property(art,obj,"protection from blindness");
            if (!_Var4) {
              get_property(art,obj,"protection from blindness",L'\0',false);
            }
          }
        }
        uVar5 = Rand_div(3);
        if (uVar5 == 0) {
          uVar5 = Rand_div(0xb);
          switch(uVar5) {
          case 0:
            _Var4 = has_property(art,obj,"acid resistance");
            if (!_Var4) {
              uVar6 = Rand_div(5);
              get_property(art,obj,"acid resistance",uVar6 * 5 + L'#',true);
            }
            switch(uVar5) {
            case 1:
              goto switchD_0018f0d3_caseD_1;
            case 2:
              goto switchD_0018f0d3_caseD_2;
            case 3:
              goto switchD_0018f0d3_caseD_3;
            case 4:
              goto switchD_0018f0d3_caseD_4;
            case 5:
              goto switchD_0018f0d3_caseD_5;
            case 6:
              goto switchD_0018f0d3_caseD_6;
            case 7:
              goto switchD_0018f0d3_caseD_7;
            case 8:
              goto switchD_0018f0d3_caseD_8;
            case 9:
              goto switchD_0018f0d3_caseD_9;
            case 10:
              goto switchD_0018f0d3_caseD_a;
            }
            break;
          case 1:
switchD_0018f0d3_caseD_1:
            _Var4 = has_property(art,obj,"electricity resistance");
            if (!_Var4) {
              uVar6 = Rand_div(5);
              get_property(art,obj,"electricity resistance",uVar6 * 5 + L'#',true);
            }
            switch(uVar5) {
            case 2:
              goto switchD_0018f0d3_caseD_2;
            case 3:
              goto switchD_0018f0d3_caseD_3;
            case 4:
              goto switchD_0018f0d3_caseD_4;
            case 5:
              goto switchD_0018f0d3_caseD_5;
            case 6:
              goto switchD_0018f0d3_caseD_6;
            case 7:
              goto switchD_0018f0d3_caseD_7;
            case 8:
              goto switchD_0018f0d3_caseD_8;
            case 9:
              goto switchD_0018f0d3_caseD_9;
            case 10:
              goto switchD_0018f0d3_caseD_a;
            }
            break;
          case 2:
switchD_0018f0d3_caseD_2:
            _Var4 = has_property(art,obj,"fire resistance");
            if (!_Var4) {
              uVar6 = Rand_div(5);
              get_property(art,obj,"fire resistance",uVar6 * 5 + L'#',true);
            }
            switch(uVar5) {
            case 3:
              goto switchD_0018f0d3_caseD_3;
            case 4:
              goto switchD_0018f0d3_caseD_4;
            case 5:
              goto switchD_0018f0d3_caseD_5;
            case 6:
              goto switchD_0018f0d3_caseD_6;
            case 7:
              goto switchD_0018f0d3_caseD_7;
            case 8:
              goto switchD_0018f0d3_caseD_8;
            case 9:
              goto switchD_0018f0d3_caseD_9;
            case 10:
              goto switchD_0018f0d3_caseD_a;
            }
            break;
          case 3:
switchD_0018f0d3_caseD_3:
            _Var4 = has_property(art,obj,"cold resistance");
            if (!_Var4) {
              uVar6 = Rand_div(5);
              get_property(art,obj,"cold resistance",uVar6 * 5 + L'#',true);
            }
            switch(uVar5) {
            case 4:
              goto switchD_0018f0d3_caseD_4;
            case 5:
              goto switchD_0018f0d3_caseD_5;
            case 6:
              goto switchD_0018f0d3_caseD_6;
            case 7:
              goto switchD_0018f0d3_caseD_7;
            case 8:
              goto switchD_0018f0d3_caseD_8;
            case 9:
              goto switchD_0018f0d3_caseD_9;
            case 10:
              goto switchD_0018f0d3_caseD_a;
            }
            break;
          case 4:
switchD_0018f0d3_caseD_4:
            _Var4 = has_property(art,obj,"poison resistance");
            if (!_Var4) {
              uVar6 = Rand_div(5);
              get_property(art,obj,"poison resistance",uVar6 * 5 + L'#',true);
            }
            switch(uVar5) {
            case 5:
              goto switchD_0018f0d3_caseD_5;
            case 6:
              goto switchD_0018f0d3_caseD_6;
            case 7:
              goto switchD_0018f0d3_caseD_7;
            case 8:
              goto switchD_0018f0d3_caseD_8;
            case 9:
              goto switchD_0018f0d3_caseD_9;
            case 10:
              goto switchD_0018f0d3_caseD_a;
            }
            break;
          case 5:
switchD_0018f0d3_caseD_5:
            _Var4 = has_property(art,obj,"light resistance");
            if (!_Var4) {
              uVar6 = Rand_div(5);
              get_property(art,obj,"light resistance",uVar6 * 5 + L'#',true);
            }
            switch(uVar5) {
            case 6:
              goto switchD_0018f0d3_caseD_6;
            case 7:
              goto switchD_0018f0d3_caseD_7;
            case 8:
              goto switchD_0018f0d3_caseD_8;
            case 9:
              goto switchD_0018f0d3_caseD_9;
            case 10:
              goto switchD_0018f0d3_caseD_a;
            }
            break;
          case 6:
switchD_0018f0d3_caseD_6:
            _Var4 = has_property(art,obj,"dark resistance");
            if (!_Var4) {
              uVar6 = Rand_div(5);
              get_property(art,obj,"dark resistance",uVar6 * 5 + L'#',true);
            }
            switch(uVar5) {
            case 7:
              goto switchD_0018f0d3_caseD_7;
            case 8:
              goto switchD_0018f0d3_caseD_8;
            case 9:
              goto switchD_0018f0d3_caseD_9;
            case 10:
              goto switchD_0018f0d3_caseD_a;
            }
            break;
          case 7:
switchD_0018f0d3_caseD_7:
            _Var4 = has_property(art,obj,"sound resistance");
            if (!_Var4) {
              uVar6 = Rand_div(5);
              get_property(art,obj,"sound resistance",uVar6 * 5 + L'#',true);
            }
            if (uVar5 == 10) goto switchD_0018f0d3_caseD_a;
            if (uVar5 == 9) goto switchD_0018f0d3_caseD_9;
            if (uVar5 == 8) goto switchD_0018f0d3_caseD_8;
            break;
          case 8:
switchD_0018f0d3_caseD_8:
            _Var4 = has_property(art,obj,"shards resistance");
            if (!_Var4) {
              uVar6 = Rand_div(5);
              get_property(art,obj,"shards resistance",uVar6 * 5 + L'#',true);
            }
            if (uVar5 == 10) goto switchD_0018f0d3_caseD_a;
            if (uVar5 == 9) goto switchD_0018f0d3_caseD_9;
            break;
          case 9:
switchD_0018f0d3_caseD_9:
            _Var4 = has_property(art,obj,"nexus resistance");
            if (!_Var4) {
              uVar6 = Rand_div(5);
              get_property(art,obj,"nexus resistance",uVar6 * 5 + L'#',true);
            }
            if (uVar5 == 10) goto switchD_0018f0d3_caseD_a;
            break;
          case 10:
switchD_0018f0d3_caseD_a:
            _Var4 = has_property(art,obj,"disenchantment resistance");
            if (!_Var4) {
              uVar5 = Rand_div(5);
              get_property(art,obj,"disenchantment resistance",uVar5 * 5 + L'#',true);
            }
          }
        }
        if ((potential < L'Ǵ') && (uVar5 = Rand_div(5), uVar5 == 0)) {
          _Var4 = has_property(art,obj,"deadliness bonus");
          if (_Var4) {
            get_property(art,obj,"deadliness bonus",potential / 0x96,true);
          }
          _Var4 = has_property(art,obj,"skill bonus");
          if (_Var4) {
            get_property(art,obj,"skill bonus",potential / 0x96,true);
          }
          potential = L'\0';
        }
      }
      if (_Var3) {
        uVar5 = Rand_div(8);
        switch(uVar5) {
        case 0:
          _Var4 = has_property(art,obj,"slow digestion");
          if (!_Var4) {
            get_property(art,obj,"slow digestion",L'\0',false);
          }
          switch(uVar5) {
          case 1:
            goto switchD_0018e12d_caseD_1;
          case 2:
            goto switchD_0018e12d_caseD_2;
          case 3:
            goto switchD_0018e12d_caseD_3;
          case 4:
            goto switchD_0018e12d_caseD_4;
          case 5:
            goto switchD_0018e12d_caseD_5;
          case 6:
            goto switchD_0018e12d_caseD_6;
          case 7:
            goto switchD_0018e12d_caseD_7;
          }
          break;
        case 1:
switchD_0018e12d_caseD_1:
          _Var4 = has_property(art,obj,"feather falling");
          if (!_Var4) {
            get_property(art,obj,"feather falling",L'\0',false);
          }
          switch(uVar5) {
          case 2:
            goto switchD_0018e12d_caseD_2;
          case 3:
            goto switchD_0018e12d_caseD_3;
          case 4:
            goto switchD_0018e12d_caseD_4;
          case 5:
            goto switchD_0018e12d_caseD_5;
          case 6:
            goto switchD_0018e12d_caseD_6;
          case 7:
            goto switchD_0018e12d_caseD_7;
          }
          break;
        case 2:
switchD_0018e12d_caseD_2:
          _Var4 = has_property(art,obj,"light");
          if (!_Var4) {
            get_property(art,obj,"light",L'\x01',false);
          }
          switch(uVar5) {
          case 3:
            goto switchD_0018e12d_caseD_3;
          case 4:
            goto switchD_0018e12d_caseD_4;
          case 5:
            goto switchD_0018e12d_caseD_5;
          case 6:
            goto switchD_0018e12d_caseD_6;
          case 7:
            goto switchD_0018e12d_caseD_7;
          }
          break;
        case 3:
switchD_0018e12d_caseD_3:
          _Var4 = has_property(art,obj,"regeneration");
          if (!_Var4) {
            get_property(art,obj,"regeneration",L'\0',false);
          }
          switch(uVar5) {
          case 4:
            goto switchD_0018e12d_caseD_4;
          case 5:
            goto switchD_0018e12d_caseD_5;
          case 6:
            goto switchD_0018e12d_caseD_6;
          case 7:
            goto switchD_0018e12d_caseD_7;
          }
          break;
        case 4:
switchD_0018e12d_caseD_4:
          _Var4 = has_property(art,obj,"see invisible");
          if (!_Var4) {
            get_property(art,obj,"see invisible",L'\0',false);
          }
          if (uVar5 == 7) goto switchD_0018e12d_caseD_7;
          if (uVar5 == 6) goto switchD_0018e12d_caseD_6;
          if (uVar5 == 5) goto switchD_0018e12d_caseD_5;
          break;
        case 5:
switchD_0018e12d_caseD_5:
          _Var4 = has_property(art,obj,"free action");
          if (!_Var4) {
            get_property(art,obj,"free action",L'\0',false);
          }
          if (uVar5 == 7) goto switchD_0018e12d_caseD_7;
          if (uVar5 == 6) goto switchD_0018e12d_caseD_6;
          break;
        case 6:
switchD_0018e12d_caseD_6:
          _Var4 = has_property(art,obj,"protection from fear");
          if (!_Var4) {
            get_property(art,obj,"protection from fear",L'\0',false);
          }
          if (uVar5 == 7) goto switchD_0018e12d_caseD_7;
          break;
        case 7:
switchD_0018e12d_caseD_7:
          _Var4 = has_property(art,obj,"protection from blindness");
          if (!_Var4) {
            get_property(art,obj,"protection from blindness",L'\0',false);
          }
        }
        uVar5 = Rand_div(2);
        if (uVar5 == 0) {
          uVar5 = Rand_div(0xb);
          switch(uVar5) {
          case 0:
            _Var4 = has_property(art,obj,"acid resistance");
            if (!_Var4) {
              uVar6 = Rand_div(5);
              get_property(art,obj,"acid resistance",uVar6 * 5 + L'#',true);
            }
            switch(uVar5) {
            case 1:
              goto switchD_0018eab5_caseD_1;
            case 2:
              goto switchD_0018eab5_caseD_2;
            case 3:
              goto switchD_0018eab5_caseD_3;
            case 4:
              goto switchD_0018eab5_caseD_4;
            case 5:
              goto switchD_0018eab5_caseD_5;
            case 6:
              goto switchD_0018eab5_caseD_6;
            case 7:
              goto switchD_0018eab5_caseD_7;
            case 8:
              goto switchD_0018eab5_caseD_8;
            case 9:
              goto switchD_0018eab5_caseD_9;
            case 10:
              goto switchD_0018eab5_caseD_a;
            }
            break;
          case 1:
switchD_0018eab5_caseD_1:
            _Var4 = has_property(art,obj,"electricity resistance");
            if (!_Var4) {
              uVar6 = Rand_div(5);
              get_property(art,obj,"electricity resistance",uVar6 * 5 + L'#',true);
            }
            switch(uVar5) {
            case 2:
              goto switchD_0018eab5_caseD_2;
            case 3:
              goto switchD_0018eab5_caseD_3;
            case 4:
              goto switchD_0018eab5_caseD_4;
            case 5:
              goto switchD_0018eab5_caseD_5;
            case 6:
              goto switchD_0018eab5_caseD_6;
            case 7:
              goto switchD_0018eab5_caseD_7;
            case 8:
              goto switchD_0018eab5_caseD_8;
            case 9:
              goto switchD_0018eab5_caseD_9;
            case 10:
              goto switchD_0018eab5_caseD_a;
            }
            break;
          case 2:
switchD_0018eab5_caseD_2:
            _Var4 = has_property(art,obj,"fire resistance");
            if (!_Var4) {
              uVar6 = Rand_div(5);
              get_property(art,obj,"fire resistance",uVar6 * 5 + L'#',true);
            }
            switch(uVar5) {
            case 3:
              goto switchD_0018eab5_caseD_3;
            case 4:
              goto switchD_0018eab5_caseD_4;
            case 5:
              goto switchD_0018eab5_caseD_5;
            case 6:
              goto switchD_0018eab5_caseD_6;
            case 7:
              goto switchD_0018eab5_caseD_7;
            case 8:
              goto switchD_0018eab5_caseD_8;
            case 9:
              goto switchD_0018eab5_caseD_9;
            case 10:
              goto switchD_0018eab5_caseD_a;
            }
            break;
          case 3:
switchD_0018eab5_caseD_3:
            _Var4 = has_property(art,obj,"cold resistance");
            if (!_Var4) {
              uVar6 = Rand_div(5);
              get_property(art,obj,"cold resistance",uVar6 * 5 + L'#',true);
            }
            switch(uVar5) {
            case 4:
              goto switchD_0018eab5_caseD_4;
            case 5:
              goto switchD_0018eab5_caseD_5;
            case 6:
              goto switchD_0018eab5_caseD_6;
            case 7:
              goto switchD_0018eab5_caseD_7;
            case 8:
              goto switchD_0018eab5_caseD_8;
            case 9:
              goto switchD_0018eab5_caseD_9;
            case 10:
              goto switchD_0018eab5_caseD_a;
            }
            break;
          case 4:
switchD_0018eab5_caseD_4:
            _Var4 = has_property(art,obj,"poison resistance");
            if (!_Var4) {
              uVar6 = Rand_div(5);
              get_property(art,obj,"poison resistance",uVar6 * 5 + L'#',true);
            }
            switch(uVar5) {
            case 5:
              goto switchD_0018eab5_caseD_5;
            case 6:
              goto switchD_0018eab5_caseD_6;
            case 7:
              goto switchD_0018eab5_caseD_7;
            case 8:
              goto switchD_0018eab5_caseD_8;
            case 9:
              goto switchD_0018eab5_caseD_9;
            case 10:
              goto switchD_0018eab5_caseD_a;
            }
            break;
          case 5:
switchD_0018eab5_caseD_5:
            _Var4 = has_property(art,obj,"light resistance");
            if (!_Var4) {
              uVar6 = Rand_div(5);
              get_property(art,obj,"light resistance",uVar6 * 5 + L'#',true);
            }
            switch(uVar5) {
            case 6:
              goto switchD_0018eab5_caseD_6;
            case 7:
              goto switchD_0018eab5_caseD_7;
            case 8:
              goto switchD_0018eab5_caseD_8;
            case 9:
              goto switchD_0018eab5_caseD_9;
            case 10:
              goto switchD_0018eab5_caseD_a;
            }
            break;
          case 6:
switchD_0018eab5_caseD_6:
            _Var4 = has_property(art,obj,"dark resistance");
            if (!_Var4) {
              uVar6 = Rand_div(5);
              get_property(art,obj,"dark resistance",uVar6 * 5 + L'#',true);
            }
            switch(uVar5) {
            case 7:
              goto switchD_0018eab5_caseD_7;
            case 8:
              goto switchD_0018eab5_caseD_8;
            case 9:
              goto switchD_0018eab5_caseD_9;
            case 10:
              goto switchD_0018eab5_caseD_a;
            }
            break;
          case 7:
switchD_0018eab5_caseD_7:
            _Var4 = has_property(art,obj,"sound resistance");
            if (!_Var4) {
              uVar6 = Rand_div(5);
              get_property(art,obj,"sound resistance",uVar6 * 5 + L'#',true);
            }
            if (uVar5 == 10) goto switchD_0018eab5_caseD_a;
            if (uVar5 == 9) goto switchD_0018eab5_caseD_9;
            if (uVar5 == 8) goto switchD_0018eab5_caseD_8;
            break;
          case 8:
switchD_0018eab5_caseD_8:
            _Var4 = has_property(art,obj,"shards resistance");
            if (!_Var4) {
              uVar6 = Rand_div(5);
              get_property(art,obj,"shards resistance",uVar6 * 5 + L'#',true);
            }
            if (uVar5 == 10) goto switchD_0018eab5_caseD_a;
            if (uVar5 == 9) goto switchD_0018eab5_caseD_9;
            break;
          case 9:
switchD_0018eab5_caseD_9:
            _Var4 = has_property(art,obj,"nexus resistance");
            if (!_Var4) {
              uVar6 = Rand_div(5);
              get_property(art,obj,"nexus resistance",uVar6 * 5 + L'#',true);
            }
            if (uVar5 == 10) goto switchD_0018eab5_caseD_a;
            break;
          case 10:
switchD_0018eab5_caseD_a:
            _Var4 = has_property(art,obj,"disenchantment resistance");
            if (!_Var4) {
              uVar5 = Rand_div(5);
              get_property(art,obj,"disenchantment resistance",uVar5 * 5 + L'#',true);
            }
          }
        }
        if ((potential < L'Ǵ') && (uVar5 = Rand_div(5), uVar5 == 0)) {
          _Var4 = has_property(art,obj,"deadliness bonus");
          if (_Var4) {
            get_property(art,obj,"deadliness bonus",potential / 0x96,true);
          }
          _Var4 = has_property(art,obj,"skill bonus");
          if (_Var4) {
            get_property(art,obj,"skill bonus",potential / 0x96,true);
          }
          potential = L'\0';
        }
      }
      uVar5 = Rand_div(0xb);
      switch(uVar5) {
      case 0:
        _Var4 = has_property(art,obj,"acid resistance");
        if (!_Var4) {
          uVar6 = Rand_div(5);
          get_property(art,obj,"acid resistance",uVar6 * 5 + L'#',true);
        }
        switch(uVar5) {
        case 1:
          goto switchD_0018e425_caseD_1;
        case 2:
          goto switchD_0018e425_caseD_2;
        case 3:
          goto switchD_0018e425_caseD_3;
        case 4:
          goto switchD_0018e425_caseD_4;
        case 5:
          goto switchD_0018e425_caseD_5;
        case 6:
          goto switchD_0018e425_caseD_6;
        case 7:
          goto switchD_0018e425_caseD_7;
        case 8:
          goto switchD_0018e425_caseD_8;
        case 9:
          goto switchD_0018e425_caseD_9;
        case 10:
          goto switchD_0018e425_caseD_a;
        }
        break;
      case 1:
switchD_0018e425_caseD_1:
        _Var4 = has_property(art,obj,"electricity resistance");
        if (!_Var4) {
          uVar6 = Rand_div(5);
          get_property(art,obj,"electricity resistance",uVar6 * 5 + L'#',true);
        }
        switch(uVar5) {
        case 2:
          goto switchD_0018e425_caseD_2;
        case 3:
          goto switchD_0018e425_caseD_3;
        case 4:
          goto switchD_0018e425_caseD_4;
        case 5:
          goto switchD_0018e425_caseD_5;
        case 6:
          goto switchD_0018e425_caseD_6;
        case 7:
          goto switchD_0018e425_caseD_7;
        case 8:
          goto switchD_0018e425_caseD_8;
        case 9:
          goto switchD_0018e425_caseD_9;
        case 10:
          goto switchD_0018e425_caseD_a;
        }
        break;
      case 2:
switchD_0018e425_caseD_2:
        _Var4 = has_property(art,obj,"fire resistance");
        if (!_Var4) {
          uVar6 = Rand_div(5);
          get_property(art,obj,"fire resistance",uVar6 * 5 + L'#',true);
        }
        switch(uVar5) {
        case 3:
          goto switchD_0018e425_caseD_3;
        case 4:
          goto switchD_0018e425_caseD_4;
        case 5:
          goto switchD_0018e425_caseD_5;
        case 6:
          goto switchD_0018e425_caseD_6;
        case 7:
          goto switchD_0018e425_caseD_7;
        case 8:
          goto switchD_0018e425_caseD_8;
        case 9:
          goto switchD_0018e425_caseD_9;
        case 10:
          goto switchD_0018e425_caseD_a;
        }
        break;
      case 3:
switchD_0018e425_caseD_3:
        _Var4 = has_property(art,obj,"cold resistance");
        if (!_Var4) {
          uVar6 = Rand_div(5);
          get_property(art,obj,"cold resistance",uVar6 * 5 + L'#',true);
        }
        switch(uVar5) {
        case 4:
          goto switchD_0018e425_caseD_4;
        case 5:
          goto switchD_0018e425_caseD_5;
        case 6:
          goto switchD_0018e425_caseD_6;
        case 7:
          goto switchD_0018e425_caseD_7;
        case 8:
          goto switchD_0018e425_caseD_8;
        case 9:
          goto switchD_0018e425_caseD_9;
        case 10:
          goto switchD_0018e425_caseD_a;
        }
        break;
      case 4:
switchD_0018e425_caseD_4:
        _Var4 = has_property(art,obj,"poison resistance");
        if (!_Var4) {
          uVar6 = Rand_div(5);
          get_property(art,obj,"poison resistance",uVar6 * 5 + L'#',true);
        }
        switch(uVar5) {
        case 5:
          goto switchD_0018e425_caseD_5;
        case 6:
          goto switchD_0018e425_caseD_6;
        case 7:
          goto switchD_0018e425_caseD_7;
        case 8:
          goto switchD_0018e425_caseD_8;
        case 9:
          goto switchD_0018e425_caseD_9;
        case 10:
          goto switchD_0018e425_caseD_a;
        }
        break;
      case 5:
switchD_0018e425_caseD_5:
        _Var4 = has_property(art,obj,"light resistance");
        if (!_Var4) {
          uVar6 = Rand_div(5);
          get_property(art,obj,"light resistance",uVar6 * 5 + L'#',true);
        }
        switch(uVar5) {
        case 6:
          goto switchD_0018e425_caseD_6;
        case 7:
          goto switchD_0018e425_caseD_7;
        case 8:
          goto switchD_0018e425_caseD_8;
        case 9:
          goto switchD_0018e425_caseD_9;
        case 10:
          goto switchD_0018e425_caseD_a;
        }
        break;
      case 6:
switchD_0018e425_caseD_6:
        _Var4 = has_property(art,obj,"dark resistance");
        if (!_Var4) {
          uVar6 = Rand_div(5);
          get_property(art,obj,"dark resistance",uVar6 * 5 + L'#',true);
        }
        switch(uVar5) {
        case 7:
          goto switchD_0018e425_caseD_7;
        case 8:
          goto switchD_0018e425_caseD_8;
        case 9:
          goto switchD_0018e425_caseD_9;
        case 10:
          goto switchD_0018e425_caseD_a;
        }
        break;
      case 7:
switchD_0018e425_caseD_7:
        _Var4 = has_property(art,obj,"sound resistance");
        if (!_Var4) {
          uVar6 = Rand_div(5);
          get_property(art,obj,"sound resistance",uVar6 * 5 + L'#',true);
        }
        if (uVar5 == 10) goto switchD_0018e425_caseD_a;
        if (uVar5 == 9) goto switchD_0018e425_caseD_9;
        if (uVar5 == 8) goto switchD_0018e425_caseD_8;
        break;
      case 8:
switchD_0018e425_caseD_8:
        _Var4 = has_property(art,obj,"shards resistance");
        if (!_Var4) {
          uVar6 = Rand_div(5);
          get_property(art,obj,"shards resistance",uVar6 * 5 + L'#',true);
        }
        if (uVar5 == 10) goto switchD_0018e425_caseD_a;
        if (uVar5 == 9) goto switchD_0018e425_caseD_9;
        break;
      case 9:
switchD_0018e425_caseD_9:
        _Var4 = has_property(art,obj,"nexus resistance");
        if (!_Var4) {
          uVar6 = Rand_div(5);
          get_property(art,obj,"nexus resistance",uVar6 * 5 + L'#',true);
        }
        if (uVar5 == 10) goto switchD_0018e425_caseD_a;
        break;
      case 10:
switchD_0018e425_caseD_a:
        _Var4 = has_property(art,obj,"disenchantment resistance");
        if (!_Var4) {
          uVar5 = Rand_div(5);
          get_property(art,obj,"disenchantment resistance",uVar5 * 5 + L'#',true);
        }
      }
      uVar5 = Rand_div(3);
      if (uVar5 == 0) {
        uVar5 = Rand_div(8);
        switch(uVar5) {
        case 0:
          _Var4 = has_property(art,obj,"slow digestion");
          if (!_Var4) {
            get_property(art,obj,"slow digestion",L'\0',false);
          }
          switch(uVar5) {
          case 1:
            goto switchD_0018e804_caseD_1;
          case 2:
            goto switchD_0018e804_caseD_2;
          case 3:
            goto switchD_0018e804_caseD_3;
          case 4:
            goto switchD_0018e804_caseD_4;
          case 5:
            goto switchD_0018e804_caseD_5;
          case 6:
            goto switchD_0018e804_caseD_6;
          case 7:
            goto switchD_0018e804_caseD_7;
          }
          break;
        case 1:
switchD_0018e804_caseD_1:
          _Var4 = has_property(art,obj,"feather falling");
          if (!_Var4) {
            get_property(art,obj,"feather falling",L'\0',false);
          }
          switch(uVar5) {
          case 2:
            goto switchD_0018e804_caseD_2;
          case 3:
            goto switchD_0018e804_caseD_3;
          case 4:
            goto switchD_0018e804_caseD_4;
          case 5:
            goto switchD_0018e804_caseD_5;
          case 6:
            goto switchD_0018e804_caseD_6;
          case 7:
            goto switchD_0018e804_caseD_7;
          }
          break;
        case 2:
switchD_0018e804_caseD_2:
          _Var4 = has_property(art,obj,"light");
          if (!_Var4) {
            get_property(art,obj,"light",L'\x01',false);
          }
          switch(uVar5) {
          case 3:
            goto switchD_0018e804_caseD_3;
          case 4:
            goto switchD_0018e804_caseD_4;
          case 5:
            goto switchD_0018e804_caseD_5;
          case 6:
            goto switchD_0018e804_caseD_6;
          case 7:
            goto switchD_0018e804_caseD_7;
          }
          break;
        case 3:
switchD_0018e804_caseD_3:
          _Var4 = has_property(art,obj,"regeneration");
          if (!_Var4) {
            get_property(art,obj,"regeneration",L'\0',false);
          }
          switch(uVar5) {
          case 4:
            goto switchD_0018e804_caseD_4;
          case 5:
            goto switchD_0018e804_caseD_5;
          case 6:
            goto switchD_0018e804_caseD_6;
          case 7:
            goto switchD_0018e804_caseD_7;
          }
          break;
        case 4:
switchD_0018e804_caseD_4:
          _Var4 = has_property(art,obj,"see invisible");
          if (!_Var4) {
            get_property(art,obj,"see invisible",L'\0',false);
          }
          if (uVar5 == 7) goto switchD_0018e804_caseD_7;
          if (uVar5 == 6) goto switchD_0018e804_caseD_6;
          if (uVar5 == 5) goto switchD_0018e804_caseD_5;
          break;
        case 5:
switchD_0018e804_caseD_5:
          _Var4 = has_property(art,obj,"free action");
          if (!_Var4) {
            get_property(art,obj,"free action",L'\0',false);
          }
          if (uVar5 == 7) goto switchD_0018e804_caseD_7;
          if (uVar5 == 6) goto switchD_0018e804_caseD_6;
          break;
        case 6:
switchD_0018e804_caseD_6:
          _Var4 = has_property(art,obj,"protection from fear");
          if (!_Var4) {
            get_property(art,obj,"protection from fear",L'\0',false);
          }
          if (uVar5 == 7) goto switchD_0018e804_caseD_7;
          break;
        case 7:
switchD_0018e804_caseD_7:
          _Var4 = has_property(art,obj,"protection from blindness");
          if (!_Var4) {
            get_property(art,obj,"protection from blindness",L'\0',false);
          }
        }
        if (((potential < L'Ǵ') && (uVar5 = Rand_div(5), uVar5 == 0)) &&
           (_Var4 = has_property(art,obj,"armor bonus"), _Var4)) {
          get_property(art,obj,"armor bonus",potential / 100,true);
          potential = L'\0';
        }
      }
    } while (L'ī' < potential);
  }
  wVar9 = Rand_div(5);
  wVar7 = L'\0';
  do {
    poVar10 = lookup_obj_property(L'\x01',wVar7);
    pcVar12 = poVar10->name;
    index = wVar7 + L'\x01';
    poVar10 = lookup_obj_property(L'\x03',index);
    if (wVar9 == wVar7) {
      prop_name = poVar10->name;
      _Var3 = has_property(art,obj,pcVar12);
      if (_Var3) {
        get_property(art,obj,prop_name,L'\0',true);
      }
    }
    wVar7 = index;
  } while (index != L'\x05');
  if (((_Var2) && (uVar5 = Rand_div(4), uVar5 == 0)) || (uVar5 = Rand_div(2), uVar5 == 0)) {
    uVar5 = Rand_div(6);
    if ((int)uVar5 < 4) {
      peVar13 = art->el_info;
      if (art == (artifact *)0x0) {
        peVar13 = obj->el_info;
      }
      peVar13[(int)uVar5].res_level = (int16_t)((peVar13[(int)uVar5].res_level * 2) / 3);
    }
    else {
      if (uVar5 == 5) {
        pcVar12 = "feather falling";
      }
      else {
        if (uVar5 != 4) goto LAB_0018faca;
        pcVar12 = "slow digestion";
      }
      get_property(art,obj,pcVar12,L'\0',true);
    }
  }
LAB_0018faca:
  piVar1 = &obj->to_a;
  piVar16 = &obj->to_h;
  if (art != (artifact *)0x0) {
    piVar16 = &art->to_h;
    piVar1 = &art->to_a;
  }
  piVar14 = &obj->to_d;
  if (art != (artifact *)0x0) {
    piVar14 = &art->to_d;
  }
  iVar15 = 3;
  do {
    piVar17 = piVar1;
    if (iVar15 == 2) {
      piVar17 = piVar16;
    }
    if (iVar15 == 1) {
      piVar17 = piVar14;
    }
    if (((int)*piVar17 + ((int)*piVar17 / 5) * -5 == 4) && (uVar5 = Rand_div(2), uVar5 == 0)) {
      sVar11 = 1;
LAB_0018fb93:
      *piVar17 = *piVar17 + sVar11;
    }
    else {
      if (((int)*piVar17 + ((int)*piVar17 / 5) * -5 == 1) && (uVar5 = Rand_div(2), uVar5 == 0)) {
        sVar11 = -1;
        goto LAB_0018fb93;
      }
      if (((int)*piVar17 & 0x80000001U) == 1) {
        uVar5 = Rand_div(4);
        sVar11 = 1;
        if (uVar5 != 0) goto LAB_0018fb93;
      }
    }
    iVar15 = iVar15 + -1;
    if (iVar15 == 0) {
      return;
    }
  } while( true );
}

Assistant:

static void haggle_till_done(struct artifact *art, struct object *obj)
{
	struct object_kind *kind = art ? lookup_kind(art->tval, art->sval) :
		lookup_kind(obj->tval, obj->sval);
	int i;
	int bonus = 0;
	int choice = 0;
	int limit = 20;
	bool weapon = tval_is_melee_weapon_k(kind);
	bool launcher = tval_is_launcher_k(kind);

	/* Initial bonuses */
	if ((one_in_(6)) && (potential >= 4500)) {
		/* Rarely, and only if the artifact has a lot of potential, add all the
		 * stats. */
		get_property(art, obj, "strength", 1, true);
		get_property(art, obj, "wisdom", 1, true);
		get_property(art, obj, "intelligence", 1, true);
		get_property(art, obj, "dexterity", 1, true);
		get_property(art, obj, "constitution", 1, true);
	} else if (!one_in_(3) && (potential >= 750)) {
		/* Otherwise, if at least some potential remains, add a numerical bonus
		 * quality or two with 67% probability. */
		int rounds = randint1(2);
		bonus = potential / 2000 + randint1(2);

		for (i = 0; i < rounds; i++) {
			/* Only melee weapons can get a bonus to tunnelling. */
			if (weapon) {
				choice = randint1(10);
			} else {
				choice = randint1(9);
			}
			switch (choice) {
				case 1: get_property(art, obj, "strength", bonus, true); break;
				case 2: get_property(art, obj, "wisdom", bonus, true); break;
				case 3: get_property(art, obj, "intelligence", bonus, true);
					break;
				case 4: get_property(art, obj, "dexterity", bonus, true);
					break;
				case 5: get_property(art, obj, "constitution", bonus, true);
					break;
				case 6: get_property(art, obj, "infravision", bonus, true);
					break;
				case 7: get_property(art, obj, "stealth", bonus, true); break;
				case 8: get_property(art, obj, "searching skill", bonus, true);
					break;
				case 9: get_property(art, obj, "speed", bonus, true); break;
				case 10: get_property(art, obj, "tunneling", bonus, true);
					break;
				default: break;
			}
		}
	}

	/* Sometimes, collect a vulnerability in exchange for more potential */
	if (one_in_(8)) {
		choice = randint1(13);
		if ((choice == 1) && !has_property(art, obj, "acid resistance")) {
			get_property(art, obj, "acid resistance", -5 * randint1(6), true);
		}
		if ((choice == 2) && !has_property(art, obj, "electricity resistance")){
			get_property(art, obj, "electricity resistance", -5 * randint1(6),
						 true);
		}
		if ((choice == 3) && !has_property(art, obj, "fire resistance")) {
			get_property(art, obj, "fire resistance", -5 * randint1(6), true);
		}
		if ((choice == 4) && !has_property(art, obj, "cold resistance")) {
			get_property(art, obj, "cold resistance", -5 * randint1(6), true);
		}
		if ((choice == 5) && !has_property(art, obj, "poison resistance")) {
			get_property(art, obj, "poison resistance", -5 * randint1(6), true);
		}
		if ((choice == 6) && !has_property(art, obj, "light resistance")) {
			get_property(art, obj, "light resistance", -5 * randint1(6), true);
		}
		if ((choice == 7) && !has_property(art, obj, "dark resistance")) {
			get_property(art, obj, "dark resistance", -5 * randint1(6), true);
		}
		if ((choice == 8) && !has_property(art, obj, "sound resistance")) {
			get_property(art, obj, "sound resistance", -5 * randint1(6), true);
		}
		if ((choice == 9) && !has_property(art, obj, "shards resistance")) {
			get_property(art, obj, "shards resistance", -5 * randint1(6), true);
		}
		if ((choice == 10) && !has_property(art, obj, "nexus resistance")) {
			get_property(art, obj, "nexus resistance", -5 * randint1(6), true);
		}
		if ((choice == 11) && !has_property(art, obj, "nether resistance")) {
			get_property(art, obj, "nether resistance", -5 * randint1(6), true);
		}
		if ((choice == 12) && !has_property(art, obj, "chaos resistance")) {
			get_property(art, obj, "chaos resistance", -5 * randint1(6), true);
		}
		if ((choice == 13) && !has_property(art, obj,
											"disenchantment resistance")) {
			get_property(art, obj, "disenchantment resistance",
						 -5 * randint1(6), true);
		}
	}

	/* Artifacts that still have lots of money to spend deserve the best. */
	if ((potential > 2000) && !one_in_(3)) {

		/* Make a choice... */
		choice = randint1(5);
		/* ...among some tasty options. */
		if ((choice == 1) && !has_property(art, obj, "telepathy")) {
			get_property(art, obj, "telepathy", 0, true);
		}
		if ((choice == 2) && !has_property(art, obj, "hold life")) {
			get_property(art, obj, "hold life", 0, true);
		}
		if (choice == 3) {
			if (!has_property(art, obj, "protection from confusion")) {
				get_property(art, obj, "protection from confusion", 0, true);
			}
			if (!has_property(art, obj, "protection from blindness")) {
				get_property(art, obj, "protection from blindness", 0, true);
			}
		}
		if (choice == 4) {
			if (one_in_(4) && !has_property(art, obj,
											"disenchantment resistance")) {
				get_property(art, obj, "disenchantment resistance", 0, true);
			} else if (one_in_(3) && !has_property(art, obj,
												   "nether resistance")) {
				get_property(art, obj, "nether resistance", 0, true);
			} else if (one_in_(2) && !has_property(art, obj,
												   "chaos resistance")) {
				get_property(art, obj, "chaos resistance", 0, true);
			} else if (!has_property(art, obj, "poison resistance")) {
				get_property(art, obj, "poison resistance", 0, true);
			}
		}
		if ((choice == 5) && (potential > 4500)) {
			if (one_in_(2) && !has_property(art, obj, "speed")) {
				get_property(art, obj, "speed", randint1(10), true);
			}

			else {
				get_property(art, obj, "sustain strength", 0, true);
				get_property(art, obj, "sustain wisdom", 0, true);
				get_property(art, obj, "sustain intelligence", 0, true);
				get_property(art, obj, "sustain dexterity", 0, true);
				get_property(art, obj, "sustain constitution", 0, true);
			}
		}
	}

	/* Sometimes, also add a new numerical bonus quality. Infravision and
	 * magical item mastery are not on offer. Only melee weapons can get a
	 * bonus to tunnelling. */
	if ((randint1(5) < 3) || (potential >= 2750)) {
		bonus = randint1(3);
		if (weapon) {
			choice = randint1(9);
		} else {
			choice = randint1(8);
		}
		if (choice == 1) {
			get_property(art, obj, "strength", bonus, true);
		}
		if (choice == 2) {
			get_property(art, obj, "wisdom", bonus, true);
		}
		if (choice == 3) {
			get_property(art, obj, "intelligence", bonus, true);
		}
		if (choice == 4) {
			get_property(art, obj, "dexterity", bonus, true);
		}
		if (choice == 5) {
			get_property(art, obj, "constitution", bonus, true);
		}
		if (choice == 6) {
			get_property(art, obj, "stealth", bonus, true);
		}
		if (choice == 7) {
			get_property(art, obj, "searching skill", bonus, true);
		}
		if (choice == 8) {
			get_property(art, obj, "speed", bonus, true);
		}
		if (choice == 9) {
			get_property(art, obj, "tunneling", bonus, true);
		}
	}

	/* Now, we enter Filene's Basement, and shop 'til we drop! (well, nearly) */
	while ((potential >= 300) && (limit-- > 0)) {

		/* I'm a melee weapon. */
		if (weapon) {
			/* Should be an artifact */
			assert(art);

			/* Some throwing weapons can be thrown hard and fast. */
			if (of_has(art->flags, OF_THROWING) && one_in_(2))
				get_property(art, obj, "perfect balance", 0, true);
			/* Some weapons already will have superb base damage. */
			if (has_property(art, obj, "enhanced dice")) {

				/* Sometimes, such weapons are unusual. */
				if (one_in_(3) && (potential >= 1500)) {
					if (art->weight == kind->weight) {
						if (one_in_(3)) {
							/* Sometimes, such weapons are unusually heavy. */
							art->weight += randint1(art->weight / 10) * 5 + 5;
							potential += (art->weight - kind->weight) * 10;
						} else if (one_in_(2) && (art->weight >= 150)) {
							/* Sometimes, such weapons are unusually light. */
							art->weight -= randint1(art->weight / 10) * 5 + 5;
							potential -= (kind->weight - art->weight) * 10;
						}
					}

					/* Sometimes spend everything to enhance the damage dice.
					 * SJGU assuming there wasn't too much to start with... */
					if (one_in_(3) && (initial_potential <= 4000)) {

						/* Probably sacrifice the Skill bonus. */
						if (!one_in_(3)) {
							art->to_h = 0;
							potential += 600;
							/* Possibly also sacrifice the Deadliness bonus. */
							if (one_in_(4)) {
								art->to_h = 0;
								potential += 600;
							}
						}
						get_property(art, obj, "enhanced dice", 1, true);
						/* We're done */
						break;
					}
				}
			} else if (randint1(art->dd * art->ds) < 5 || potential >= 2100) {
				/* Other weapons have enhanced damage dice in addition to other
				 * qualities.
				 * SJGU increased chance of this as small dice are useless */
				get_property(art, obj, "enhanced dice", 3, true);
			}

			/* Collect a slay or brand. */
			choice = randint1(13);
			if ((choice == 1) && !has_property(art, obj, "slay animals")) {
				get_property(art, obj, "slay animals", 17, true);
			}
			if ((choice == 2) && !has_property(art, obj,
											   "slay evil creatures")) {
				get_property(art, obj, "slay evil creatures", 15, true);
			}
			if ((choice == 3) && !has_property(art, obj, "slay undead")) {
				get_property(art, obj, "slay undead", 20, true);
			}
			if ((choice == 4) && !has_property(art, obj, "slay demons")) {
				get_property(art, obj, "slay demons", 20, true);
			}
			if ((choice == 5) && !has_property(art, obj, "slay orcs")) {
				get_property(art, obj, "slay orcs", 20, true);
			}
			if ((choice == 6) && !has_property(art, obj, "slay trolls")) {
				get_property(art, obj, "slay trolls", 20, true);
			}
			if ((choice == 7) && !has_property(art, obj, "slay giants")) {
				get_property(art, obj, "slay giants", 20, true);
			}
			if ((choice == 8) && !has_property(art, obj, "slay dragons")) {
				get_property(art, obj, "slay dragons", 20, true);
			}
			if ((choice == 9) && !has_property(art, obj, "acid brand")) {
				get_property(art, obj, "acid brand", 17, true);
			}
			if ((choice == 10) && !has_property(art, obj, "lightning brand")) {
				get_property(art, obj, "lightning brand", 17, true);
			}
			if ((choice == 11) && !has_property(art, obj, "fire brand")) {
				get_property(art, obj, "fire brand", 17, true);
			}
			if ((choice == 12) && !has_property(art, obj, "cold brand")) {
				get_property(art, obj, "cold brand", 17, true);
			}
			if ((choice == 13) && !has_property(art, obj, "poison brand")) {
				get_property(art, obj, "poison brand", 17, true);
			}
			/* Often, collect a miscellaneous quality, if it is affordable. */
			if (one_in_(2)) {
				choice = randint1(8);
				if ((choice == 1) && !has_property(art, obj, "slow digestion")){
					get_property(art, obj, "slow digestion", 0, false);
				}
				if ((choice == 2) &&
					!has_property(art, obj, "feather falling")) {
					get_property(art, obj, "feather falling", 0, false);
				}
				if ((choice == 3) && !has_property(art, obj, "light")) {
					get_property(art, obj, "light", 1, false);
				}
				if ((choice == 4) && !has_property(art, obj, "regeneration")) {
					get_property(art, obj, "regeneration", 0, false);
				}
				if ((choice == 5) && !has_property(art, obj, "see invisible")) {
					get_property(art, obj, "see invisible", 0, false);
				}
				if ((choice == 6) && !has_property(art, obj, "free action")) {
					get_property(art, obj, "free action", 0, false);
				}
				if ((choice == 7) &&
					!has_property(art, obj, "protection from fear")) {
					get_property(art, obj, "protection from fear", 0, false);
				}
				if ((choice == 8) &&
					!has_property(art, obj, "protection from blindness")) {
					get_property(art, obj, "protection from blindness", 0,
								 false);
				}
			}

			/* Sometimes, collect a resistance, if it is affordable. */
			if (one_in_(3)) {
				choice = randint1(11);
				if ((choice == 1) &&
					!has_property(art, obj, "acid resistance")) {
					get_property(art, obj, "acid resistance",
								 35 + 5 * randint0(5), true);
				}
				if ((choice == 2) &&
					!has_property(art, obj, "electricity resistance")){
					get_property(art, obj, "electricity resistance",
								 35 + 5 * randint0(5), true);
				}
				if ((choice == 3) &&
					!has_property(art, obj, "fire resistance")) {
					get_property(art, obj, "fire resistance",
								 35 + 5 * randint0(5), true);
				}
				if ((choice == 4) &&
					!has_property(art, obj, "cold resistance")) {
					get_property(art, obj, "cold resistance",
								 35 + 5 * randint0(5), true);
				}
				if ((choice == 5) &&
					!has_property(art, obj, "poison resistance")) {
					get_property(art, obj, "poison resistance",
								 35 + 5 * randint0(5), true);
				}
				if ((choice == 6) &&
					!has_property(art, obj, "light resistance")) {
					get_property(art, obj, "light resistance",
								 35 + 5 * randint0(5), true);
				}
				if ((choice == 7) &&
					!has_property(art, obj, "dark resistance")) {
					get_property(art, obj, "dark resistance",
								 35 + 5 * randint0(5), true);
				}
				if ((choice == 8) &&
					!has_property(art, obj, "sound resistance")) {
					get_property(art, obj, "sound resistance",
								 35 + 5 * randint0(5), true);
				}
				if ((choice == 9) &&
					!has_property(art, obj, "shards resistance")) {
					get_property(art, obj, "shards resistance",
								 35 + 5 * randint0(5), true);
				}
				if ((choice == 10) &&
					!has_property(art, obj, "nexus resistance")) {
					get_property(art, obj, "nexus resistance",
								 35 + 5 * randint0(5), true);
				}
				if ((choice == 11) &&
					!has_property(art, obj, "disenchantment resistance")) {
					get_property(art, obj, "disenchantment resistance",
								 35 + 5 * randint0(5), true);
				}
			}

			/* Clean out the wallet. */
			if ((potential < 500) && one_in_(5)) {
				if (has_property(art, obj, "deadliness bonus")) {
					get_property(art, obj, "deadliness bonus",
								 potential / 150, true);
				}
				if (has_property(art, obj, "skill bonus")) {
					get_property(art, obj, "skill bonus",
								 potential / 150, true);
				}
				potential = 0;
			}
		}

		/* I'm a missile weapon. */
		if (launcher) {
			/* Collect a miscellaneous quality. */
			choice = randint1(8);
			if ((choice == 1) && !has_property(art, obj, "slow digestion")){
				get_property(art, obj, "slow digestion", 0, false);
			}
			if ((choice == 2) &&
				!has_property(art, obj, "feather falling")) {
				get_property(art, obj, "feather falling", 0, false);
			}
			if ((choice == 3) && !has_property(art, obj, "light")) {
				get_property(art, obj, "light", 1, false);
			}
			if ((choice == 4) && !has_property(art, obj, "regeneration")) {
				get_property(art, obj, "regeneration", 0, false);
			}
			if ((choice == 5) && !has_property(art, obj, "see invisible")) {
				get_property(art, obj, "see invisible", 0, false);
			}
			if ((choice == 6) && !has_property(art, obj, "free action")) {
				get_property(art, obj, "free action", 0, false);
			}
			if ((choice == 7) &&
				!has_property(art, obj, "protection from fear")) {
				get_property(art, obj, "protection from fear", 0, false);
			}
			if ((choice == 8) &&
				!has_property(art, obj, "protection from blindness")) {
				get_property(art, obj, "protection from blindness", 0, false);
			}
			/* Sometimes, collect a resistance, if it is affordable. */
			if (one_in_(2)) {
				choice = randint1(11);
				if ((choice == 1) &&
					!has_property(art, obj, "acid resistance")) {
					get_property(art, obj, "acid resistance",
								 35 + 5 * randint0(5), true);
				}
				if ((choice == 2) &&
					!has_property(art, obj, "electricity resistance")){
					get_property(art, obj, "electricity resistance",
								 35 + 5 * randint0(5), true);
				}
				if ((choice == 3) &&
					!has_property(art, obj, "fire resistance")) {
					get_property(art, obj, "fire resistance",
								 35 + 5 * randint0(5), true);
				}
				if ((choice == 4) &&
					!has_property(art, obj, "cold resistance")) {
					get_property(art, obj, "cold resistance",
								 35 + 5 * randint0(5), true);
				}
				if ((choice == 5) &&
					!has_property(art, obj, "poison resistance")) {
					get_property(art, obj, "poison resistance",
								 35 + 5 * randint0(5), true);
				}
				if ((choice == 6) &&
					!has_property(art, obj, "light resistance")) {
					get_property(art, obj, "light resistance",
								 35 + 5 * randint0(5), true);
				}
				if ((choice == 7) &&
					!has_property(art, obj, "dark resistance")) {
					get_property(art, obj, "dark resistance",
								 35 + 5 * randint0(5), true);
				}
				if ((choice == 8) &&
					!has_property(art, obj, "sound resistance")) {
					get_property(art, obj, "sound resistance",
								 35 + 5 * randint0(5), true);
				}
				if ((choice == 9) &&
					!has_property(art, obj, "shards resistance")) {
					get_property(art, obj, "shards resistance",
								 35 + 5 * randint0(5), true);
				}
				if ((choice == 10) &&
					!has_property(art, obj, "nexus resistance")) {
					get_property(art, obj, "nexus resistance",
								 35 + 5 * randint0(5), true);
				}
				if ((choice == 11) &&
					!has_property(art, obj, "disenchantment resistance")) {
					get_property(art, obj, "disenchantment resistance",
								 35 + 5 * randint0(5), true);
				}
			}

			/* Clean out the wallet. */
			if ((potential < 500) && one_in_(5)) {
				if (has_property(art, obj, "deadliness bonus")) {
					get_property(art, obj, "deadliness bonus",
								 potential / 150, true);
				}
				if (has_property(art, obj, "skill bonus")) {
					get_property(art, obj, "skill bonus",
								 potential / 150, true);
				}
				potential = 0;
			}
		}

		/* I'm any piece of armour or jewellery. */

		/* Collect a resistance. */
		choice = randint1(11);
		if ((choice == 1) && !has_property(art, obj, "acid resistance")) {
			get_property(art, obj, "acid resistance",
						 35 + 5 * randint0(5), true);
		}
		if ((choice == 2) && !has_property(art, obj, "electricity resistance")){
			get_property(art, obj, "electricity resistance",
						 35 + 5 * randint0(5), true);
		}
		if ((choice == 3) && !has_property(art, obj, "fire resistance")) {
			get_property(art, obj, "fire resistance",
						 35 + 5 * randint0(5), true);
		}
		if ((choice == 4) && !has_property(art, obj, "cold resistance")) {
			get_property(art, obj, "cold resistance",
						 35 + 5 * randint0(5), true);
		}
		if ((choice == 5) && !has_property(art, obj, "poison resistance")) {
			get_property(art, obj, "poison resistance",
						 35 + 5 * randint0(5), true);
		}
		if ((choice == 6) && !has_property(art, obj, "light resistance")) {
			get_property(art, obj, "light resistance",
						 35 + 5 * randint0(5), true);
		}
		if ((choice == 7) && !has_property(art, obj, "dark resistance")) {
			get_property(art, obj, "dark resistance",
						 35 + 5 * randint0(5), true);
		}
		if ((choice == 8) && !has_property(art, obj, "sound resistance")) {
			get_property(art, obj, "sound resistance",
						 35 + 5 * randint0(5), true);
		}
		if ((choice == 9) && !has_property(art, obj, "shards resistance")) {
			get_property(art, obj, "shards resistance",
						 35 + 5 * randint0(5), true);
		}
		if ((choice == 10) && !has_property(art, obj, "nexus resistance")) {
			get_property(art, obj, "nexus resistance",
						 35 + 5 * randint0(5), true);
		}
		if ((choice == 11) &&
			!has_property(art, obj, "disenchantment resistance")) {
			get_property(art, obj, "disenchantment resistance",
						 35 + 5 * randint0(5), true);
		}
		/* Sometimes, collect a miscellaneous quality, if it is affordable. */
		if (one_in_(3)) {
			choice = randint1(8);
			if ((choice == 1) && !has_property(art, obj, "slow digestion")){
				get_property(art, obj, "slow digestion", 0, false);
			}
			if ((choice == 2) &&
				!has_property(art, obj, "feather falling")) {
				get_property(art, obj, "feather falling", 0, false);
			}
			if ((choice == 3) && !has_property(art, obj, "light")) {
				get_property(art, obj, "light", 1, false);
			}
			if ((choice == 4) && !has_property(art, obj, "regeneration")) {
				get_property(art, obj, "regeneration", 0, false);
			}
			if ((choice == 5) && !has_property(art, obj, "see invisible")) {
				get_property(art, obj, "see invisible", 0, false);
			}
			if ((choice == 6) && !has_property(art, obj, "free action")) {
				get_property(art, obj, "free action", 0, false);
			}
			if ((choice == 7) &&
				!has_property(art, obj, "protection from fear")) {
				get_property(art, obj, "protection from fear", 0, false);
			}
			if ((choice == 8) &&
				!has_property(art, obj, "protection from blindness")) {
				get_property(art, obj, "protection from blindness", 0, false);
			}

			/* Clean out the wallet. */
			if ((potential < 500) && one_in_(5)) {
				if (has_property(art, obj, "armor bonus")) {
					get_property(art, obj, "armor bonus", potential/ 100, true);
					potential = 0;
				}
			}
		}
	}

	/* On sale free! Last chance! */

	/* If an artifact affects a stat, it may also possibly sustain it. */
	choice = randint0(STAT_MAX);
	for (i = 0; i < STAT_MAX; i++) {
		const char *stat = lookup_obj_property(OBJ_PROPERTY_STAT, i)->name;
		const char *sust = lookup_obj_property(OBJ_PROPERTY_FLAG, i + 1)->name;
		if ((choice == i) && has_property(art, obj, stat)) {
			get_property(art, obj, sust, 0, true);
		}
	}

	/* Armour gets a basic resist or low-level ability with 50% probability,
	 * and weapons with 25% probability. */
	if ((weapon && one_in_(4)) || one_in_(2)) {
		int16_t *res;
		choice = randint0(6);
		res = art ? &(art->el_info[choice].res_level) :
			&(obj->el_info[choice].res_level);
		if (choice < 4) {
			*res = ((*res) * 2) / 3;
		} else if (choice == 4) {
			get_property(art, obj, "slow digestion", 0, true);
		} else if (choice == 5) {
			get_property(art, obj, "feather falling", 0, true);
		}
	}

	/* Frequently neaten bonuses to Armour Class, Skill, and Deadliness. */
	for (i = 0; i < 3; i++) {
		int16_t *bonus_chg = art ? &art->to_a : &obj->to_a;
		if (i == 1) { 
			bonus_chg = art ? &art->to_h : &obj->to_h;
		}
		if (i == 2) { 
			bonus_chg = art ? &art->to_d : &obj->to_d;
		}
		if (((*bonus_chg) % 5 == 4) && one_in_(2)) {
			(*bonus_chg)++;
		} else if (((*bonus_chg) % 5 == 1) && one_in_(2)) {
			(*bonus_chg)--;
		} else if (((*bonus_chg) % 2 == 1) && !one_in_(4)) {
			(*bonus_chg)++;
		}
	}
}